

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall
kratos::Simulator::set_complex_value_
          (Simulator *this,Var *var,
          optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *op_value)

{
  unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_00;
  pointer pcVar1;
  uint uVar2;
  uint32_t uVar3;
  uint *puVar4;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  byte bVar8;
  int iVar9;
  const_iterator __begin3;
  iterator iVar10;
  mapped_type *pmVar11;
  unsigned_long *puVar12;
  uint *puVar13;
  iterator iVar14;
  iterator iVar15;
  mapped_type *pmVar16;
  InternalException *pIVar17;
  UserException *pUVar18;
  uint64_t i;
  size_type sVar19;
  undefined1 auVar20 [8];
  uint64_t i_1;
  long lVar21;
  size_type __n;
  uint32_t bit;
  uint32_t uVar22;
  bool bVar23;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar24;
  optional<unsigned_long> op_value_00;
  pair<unsigned_int,_unsigned_int> local_e8;
  undefined1 local_d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> value;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  undefined1 local_a0 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  changed_bits;
  vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> values;
  Var *var_local;
  Var *root;
  Var *fill_var;
  
  if ((op_value->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged == true) {
    values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)var;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)op_value);
    puVar12 = values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[0x14];
    if (((long)values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[0x15] - (long)puVar12 == 4) &&
       ((uint)*puVar12 == 1)) {
      if (8 < (ulong)((long)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start - (long)local_d8)) {
        pUVar18 = (UserException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_a0,"Cannot set multiple values to a scalar",
                   (allocator<char> *)&changed_bits._M_h._M_single_bucket);
        UserException::UserException(pUVar18,(string *)local_a0);
        __cxa_throw(pUVar18,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      op_value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = 1;
      op_value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value =
           *(_Storage<unsigned_long,_true> *)local_d8;
      set_value_(this,(Var *)values.
                             super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,op_value_00);
    }
    else {
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      changed_bits._M_h._M_single_bucket = (__node_base_ptr)0x0;
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      if (*(int *)(values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x2d) == 2) {
        var_local = (Var *)(*(code *)(*values.
                                       super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)[0x28])
                                     (values.
                                      super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        root = var_local;
        get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)&value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,this,
                        (Var *)values.
                               super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((pointer)CONCAT44(value.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              (int)value.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage) ==
            index.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a0,"Empty slice",(allocator<char> *)((long)&fill_var + 7));
          InternalException::InternalException(pIVar17,(string *)local_a0);
          __cxa_throw(pIVar17,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        local_e8 = compute_var_high_low
                             (var_local,
                              (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                               *)&value.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        index.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((ulong)local_e8 >> 0x20);
        uVar2 = var_local->var_width_;
        if (((int)((ulong)index.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage % (ulong)uVar2) != 0)
           || ((int)(((ulong)local_e8 & 0xffffffff) % (ulong)uVar2) != uVar2 - 1)) {
          pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a0,"Misaligned vector slicing",
                     (allocator<char> *)((long)&fill_var + 7));
          InternalException::InternalException(pIVar17,(string *)local_a0);
          __cxa_throw(pIVar17,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        puVar13 = (var_local->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (var_local->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (((long)puVar4 - (long)puVar13 == 4) && (*puVar13 == 1)) {
          iVar10 = std::
                   _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)this,&var_local);
          if (iVar10.
              super__Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false>.
              _M_cur == (__node_type *)0x0) {
            pmVar11 = std::__detail::
                      _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this,&var_local);
            *pmVar11 = 0;
          }
          local_a0 = (undefined1  [8])
                     std::__detail::
                     _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&var_local);
          std::vector<unsigned_long*,std::allocator<unsigned_long*>>::
          _M_assign_aux<unsigned_long*const*>
                    ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)
                     &changed_bits._M_h._M_single_bucket,local_a0);
          __n = 1;
        }
        else {
          __n = 1;
          for (; puVar13 != puVar4; puVar13 = puVar13 + 1) {
            __n = __n * *puVar13;
          }
          pmVar16 = std::__detail::
                    _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->complex_values_,&var_local);
          std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::reserve
                    ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)
                     &changed_bits._M_h._M_single_bucket,__n);
          lVar21 = 0;
          sVar19 = __n;
          while (bVar23 = sVar19 != 0, sVar19 = sVar19 - 1, bVar23) {
            local_a0 = (undefined1  [8])
                       ((long)(pmVar16->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar21);
            std::vector<unsigned_long*,std::allocator<unsigned_long*>>::emplace_back<unsigned_long*>
                      ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)
                       &changed_bits._M_h._M_single_bucket,(unsigned_long **)local_a0);
            lVar21 = lVar21 + 8;
          }
        }
        std::
        _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)&value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        __n = 1;
        for (; puVar12 !=
               values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[0x15];
            puVar12 = (unsigned_long *)((long)puVar12 + 4)) {
          __n = __n * (uint)*puVar12;
        }
        root = (Var *)values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_e8.first = (int)__n - 1;
        local_e8.second = 0;
        index.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      this_00 = &this->complex_values_;
      iVar14 = std::
               _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&this_00->_M_h,&root);
      if ((iVar14.
           super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
           ._M_cur == (__node_type *)0x0) &&
         (iVar15 = std::
                   _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&this_00->_M_h,&root),
         iVar15.
         super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
         ._M_cur == (__node_type *)0x0)) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,__n,
                   (allocator_type *)
                   &value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        for (sVar19 = 0; __n != sVar19; sVar19 = sVar19 + 1) {
          pcVar1 = (pointer)((long)local_a0 + sVar19 * 8);
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
        }
        std::
        _Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<kratos::Var_const*&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                  ((_Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)this_00,
                   &values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,local_a0);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0);
      }
      if (*(int *)(values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x2d) != 2) {
        std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::reserve
                  ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)
                   &changed_bits._M_h._M_single_bucket,__n);
        pmVar16 = std::__detail::
                  _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)this_00,
                       (key_type *)
                       &values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        lVar21 = 0;
        while (bVar23 = __n != 0, __n = __n - 1, bVar23) {
          local_a0 = (undefined1  [8])
                     ((long)(pmVar16->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar21);
          std::vector<unsigned_long*,std::allocator<unsigned_long*>>::emplace_back<unsigned_long*>
                    ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)
                     &changed_bits._M_h._M_single_bucket,(unsigned_long **)local_a0);
          lVar21 = lVar21 + 8;
        }
      }
      if ((long)values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl
                .super__Vector_impl_data._M_start - (long)changed_bits._M_h._M_single_bucket !=
          (long)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start - (long)local_d8) {
        iVar9 = (*(root->super_IRNode)._vptr_IRNode[0x18])();
        if ((char)iVar9 == '\0') {
          pUVar18 = (UserException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a0,"Misaligned slicing",
                     (allocator<char> *)
                     &value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          UserException::UserException(pUVar18,(string *)local_a0);
          __cxa_throw(pUVar18,&UserException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (8 < (ulong)((long)value.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)local_d8)) {
          pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a0,"Multiple value assigned to packed array not supported",
                     (allocator<char> *)
                     &value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          InternalException::InternalException(pIVar17,(string *)local_a0);
          __cxa_throw(pIVar17,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar5 = *(ulong *)local_d8;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,
                   (long)values.
                         super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                         _M_impl.super__Vector_impl_data._M_start -
                   (long)changed_bits._M_h._M_single_bucket >> 3,
                   (allocator_type *)
                   &value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        for (lVar21 = 0;
            (long)values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                  _M_impl.super__Vector_impl_data._M_start -
            (long)changed_bits._M_h._M_single_bucket >> 3 != lVar21; lVar21 = lVar21 + 1) {
          bVar8 = (byte)root->var_width_;
          *(ulong *)((long)local_a0 + lVar21 * 8) =
               ~(-1L << (bVar8 & 0x3f)) & uVar5 >> (bVar8 * (char)lVar21 & 0x3f);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0);
      }
      local_a0 = (undefined1  [8])&changed_bits._M_h._M_rehash_policy._M_next_resize;
      changed_bits._M_h._M_buckets = (__buckets_ptr)0x1;
      changed_bits._M_h._M_bucket_count = 0;
      changed_bits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      changed_bits._M_h._M_element_count._0_4_ = 0x3f800000;
      changed_bits._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      changed_bits._M_h._M_rehash_policy._4_4_ = 0;
      changed_bits._M_h._M_rehash_policy._M_next_resize = 0;
      uVar3 = root->var_width_;
      iVar9 = (int)index.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage * uVar3;
      while( true ) {
        if (local_e8.first <
            (uint)index.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) break;
        p_Var6 = (changed_bits._M_h._M_single_bucket
                  [(long)index.
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage]._M_nxt)->_M_nxt;
        p_Var7 = (_Hash_node_base *)
                 ((_Storage<unsigned_long,_true> *)
                 ((long)local_d8 +
                 index.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage * 8))->_M_value;
        if ((iVar14.
             super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
             ._M_cur == (__node_type *)0x0) || (p_Var6 != p_Var7)) {
          (changed_bits._M_h._M_single_bucket
           [(long)index.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage]._M_nxt)->_M_nxt = p_Var7;
          auVar20 = local_d8;
          for (uVar22 = 0; uVar3 != uVar22; uVar22 = uVar22 + 1) {
            if ((iVar14.
                 super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                 ._M_cur == (__node_type *)0x0) ||
               ((1 << ((byte)uVar22 & 0x1f) & ((uint)p_Var6 ^ (uint)p_Var7)) != 0)) {
              value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = iVar9 + uVar22;
              pVar24 = std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::_M_emplace<unsigned_int>
                                 ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                   *)local_a0,
                                  &value.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,auVar20);
              auVar20 = pVar24._8_8_;
            }
          }
        }
        index.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(ulong)((uint)index.
                                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        iVar9 = iVar9 + uVar3;
      }
      trigger_event(this,root,
                    (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_a0);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_a0);
      std::_Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>::~_Vector_base
                ((_Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)
                 &changed_bits._M_h._M_single_bucket);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8);
  }
  return;
}

Assistant:

void Simulator::set_complex_value_(const kratos::Var *var,
                                   const std::optional<std::vector<uint64_t>> &op_value) {
    if (!op_value) return;
    auto value = *op_value;
    if (var->size().size() == 1 && var->size().front() == 1) {
        if (value.size() > 1) throw UserException("Cannot set multiple values to a scalar");
        set_value_(var, value[0]);
        return;
    }
    std::vector<uint64_t *> values;
    uint64_t base = 1;
    const Var *fill_var;
    uint32_t low, high;
    if (var->type() == VarType::Slice) {
        const auto *root = var->get_var_root_parent();
        fill_var = root;
        auto index = get_slice_index(var);
        if (index.empty()) throw InternalException("Empty slice");
        auto const [var_high, var_low] = compute_var_high_low(root, index);
        if (var_low % root->var_width() != 0 ||
            (var_high % root->var_width() != root->var_width() - 1))
            throw InternalException("Misaligned vector slicing");
        low = var_low;
        high = var_high;
        if (root->size().size() == 1 && root->size().front() == 1) {
            // this is size one
            if (values_.find(root) == values_.end()) values_[root] = 0;
            values = {&values_.at(root)};
        } else {
            for (uint32_t s : root->size()) {
                base *= s;
            }
            std::vector<uint64_t> &v_ref = complex_values_.at(root);
            values.reserve(base);
            for (uint64_t i = 0; i < base; i++) values.emplace_back(&v_ref[i]);
        }
    } else {
        for (uint32_t s : var->size()) {
            base *= s;
        }
        fill_var = var;
        low = 0;
        high = base - 1;
    }
    bool fill_in = false;
    if (complex_values_.find(fill_var) == complex_values_.end()) {
        // whatever bits changed
        // fill in values
        fill_in = true;
        if (complex_values_.find(fill_var) == complex_values_.end()) {
            // fill in values
            std::vector<uint64_t> v(base);
            for (uint64_t i = 0; i < base; i++) v[i] = 0;
            complex_values_.emplace(var, v);
        }
    }

    // get values
    if (var->type() != VarType::Slice) {
        values.reserve(base);
        auto &v_ref = complex_values_.at(var);
        for (uint64_t i = 0; i < base; i++) values.emplace_back(&v_ref[i]);
    }

    if (values.size() != value.size()) {
        // expand the value to if the target is packed
        if (fill_var->is_packed()) {
            if (value.size() > 1) {
                throw InternalException("Multiple value assigned to packed array not supported");
            }
            auto v = value[0];
            std::vector<uint64_t> v_(values.size());
            for (uint64_t i = 0; i < values.size(); i++) {
                auto w = fill_var->var_width();
                v_[i] = (v >> (w * i)) & (~(UINT64_MASK << w));
            }
            value = v_;
        } else {
            throw UserException("Misaligned slicing");
        }
    }
    std::unordered_set<uint32_t> changed_bits;
    uint32_t var_width = fill_var->var_width();

    for (uint32_t i = low; i <= high; i++) {
        if (*(values[i]) != value[i] || fill_in) {
            uint32_t bit_mask = (*values[i]) ^ value[i];
            *(values[i]) = value[i];
            for (uint32_t bit = 0; bit < var_width; bit++) {
                if ((bit_mask >> bit) & 1u || fill_in) {
                    changed_bits.emplace(bit + var_width * i);
                }
            }
        }
    }
    trigger_event(fill_var, changed_bits);
}